

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

char * Ses_ManExtractSolution(Ses_Man_t *pSes)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  void *__ptr;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  void *pvVar11;
  size_t __nmemb;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  
  iVar16 = pSes->nGates;
  iVar18 = pSes->nSpecVars;
  iVar7 = pSes->nSpecFunc;
  __nmemb = (size_t)((iVar18 + 2) * iVar7 + iVar16 * 4 + 3);
  pcVar5 = (char *)calloc(__nmemb,1);
  *pcVar5 = (char)iVar18;
  pcVar5[1] = (char)iVar7;
  pcVar10 = pcVar5 + 3;
  pcVar5[2] = (char)iVar16;
  uVar3 = pSes->nGates;
  if (0 < (int)uVar3) {
    iVar16 = 2;
    uVar4 = 0;
    iVar18 = 0;
    do {
      uVar3 = iVar18 * 3 + pSes->nGateOffset;
      if ((int)uVar3 < 0) {
LAB_002c0b05:
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      iVar7 = pSes->pSat->size;
      if ((((iVar7 <= (int)uVar3) || (uVar8 = uVar3 + 1, (int)uVar8 < 0)) || (iVar7 <= (int)uVar8))
         || ((uVar6 = uVar3 + 2, (int)uVar6 < 0 || (iVar7 <= (int)uVar6)))) goto LAB_002c0b05;
      piVar1 = pSes->pSat->model;
      *pcVar10 = (piVar1[uVar3] == 1) + (piVar1[uVar8] == 1) * '\x02' +
                 (piVar1[uVar6] == 1) * '\x04';
      pcVar10[1] = '\x02';
      if (pSes->fExtractVerbose != 0) {
        printf("add gate %d with operation %d",(ulong)(uint)(pSes->nSpecVars + iVar18));
      }
      pcVar10 = pcVar10 + 2;
      iVar17 = pSes->nSpecVars;
      bVar2 = 0 < iVar17 + iVar18;
      iVar7 = iVar17 + iVar18;
      if (iVar7 != 0 && SCARRY4(iVar17,iVar18) == iVar7 < 0) {
        uVar3 = 0;
        do {
          if (0 < (int)uVar3) {
            if (pSes->nGates <= iVar18) {
              __assert_fail("i < pSes->nGates",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                            ,999,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
            }
            if (!bVar2) {
              __assert_fail("k < pSes->nSpecVars + i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                            ,1000,"int Ses_ManSelectVar(Ses_Man_t *, int, int, int)");
            }
            uVar9 = 0;
            do {
              iVar13 = pSes->nSelectOffset;
              iVar14 = iVar17;
              if (iVar18 != 0) {
                do {
                  iVar13 = iVar13 + ((iVar14 + -1) * iVar14) / 2;
                  iVar14 = iVar14 + 1;
                } while (iVar14 < iVar7);
              }
              uVar8 = (uint)uVar9;
              uVar6 = ~uVar8 + uVar3 + (int)((iVar7 * 2 + ~uVar8) * uVar8) / 2 + iVar13;
              if (((int)uVar6 < 0) || (pSes->pSat->size <= (int)uVar6)) goto LAB_002c0b05;
              if (pSes->pSat->model[uVar6] == 1) {
                if (pSes->fExtractVerbose != 0) {
                  printf(" and operands %d and %d",uVar9,(ulong)uVar3);
                }
                *pcVar10 = (char)uVar9;
                pcVar10[1] = (char)uVar3;
                pcVar10 = pcVar10 + 2;
                uVar3 = pSes->nSpecVars + iVar18;
                break;
              }
              uVar9 = (ulong)(uVar8 + 1);
            } while (uVar8 + 1 != uVar3);
          }
          uVar3 = uVar3 + 1;
          iVar17 = pSes->nSpecVars;
          iVar7 = iVar17 + iVar18;
          bVar2 = (int)uVar3 < iVar7;
        } while ((int)uVar3 < iVar7);
      }
      if (pSes->fExtractVerbose != 0) {
        if (0 < pSes->nMaxDepth) {
          printf(" and depth vector ");
          iVar7 = pSes->nArrTimeMax;
          if (-1 < iVar7 + iVar18) {
            iVar17 = -1;
            do {
              if (pSes->nGates <= iVar18) {
                __assert_fail("i < pSes->nGates",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                              ,0x3f4,"int Ses_ManDepthVar(Ses_Man_t *, int, int)");
              }
              uVar3 = iVar7 * iVar18 + pSes->nDepthOffset + (uVar4 >> 1) + iVar17 + 1;
              if (((int)uVar3 < 0) || (pSes->pSat->size <= (int)uVar3)) goto LAB_002c0b05;
              printf("%d",(ulong)(pSes->pSat->model[uVar3] == 1));
              iVar7 = pSes->nArrTimeMax;
              iVar17 = iVar17 + 1;
            } while (iVar17 < iVar7 + iVar18);
          }
        }
        putchar(10);
      }
      iVar18 = iVar18 + 1;
      uVar3 = pSes->nGates;
      uVar4 = uVar4 + iVar16;
      iVar16 = iVar16 + 2;
    } while (iVar18 < (int)uVar3);
  }
  if (pSes->nMaxDepth == -1) {
    __ptr = (void *)0x0;
  }
  else {
    uVar4 = pSes->nSpecVars;
    __ptr = calloc((long)(int)(uVar4 * uVar3),4);
    if (0 < (int)uVar3) {
      uVar9 = 0;
      pvVar11 = __ptr;
      do {
        if (0 < (int)uVar4) {
          uVar8 = (uint)pcVar5[uVar9 * 4 + 6];
          uVar6 = (uint)pcVar5[uVar9 * 4 + 5];
          uVar15 = 0;
          do {
            iVar18 = 0;
            iVar16 = 0;
            if ((int)uVar4 <= (int)uVar6) {
              iVar16 = *(int *)((long)__ptr + uVar15 * 4 + (long)(int)((uVar6 - uVar4) * uVar4) * 4)
              ;
            }
            if ((int)uVar4 <= (int)uVar8) {
              iVar18 = *(int *)((long)__ptr + uVar15 * 4 + (long)(int)((uVar8 - uVar4) * uVar4) * 4)
              ;
            }
            if (iVar16 == 0 && iVar18 == 0) {
              uVar19 = (uint)(uVar8 == uVar15 || uVar6 == uVar15);
            }
            else {
              if (iVar18 < iVar16) {
                iVar18 = iVar16;
              }
              uVar19 = iVar18 + 1;
            }
            *(uint *)((long)pvVar11 + uVar15 * 4) = uVar19;
            uVar15 = uVar15 + 1;
          } while (uVar4 != uVar15);
        }
        uVar9 = uVar9 + 1;
        pvVar11 = (void *)((long)pvVar11 + (ulong)uVar4 * 4);
      } while (uVar9 != uVar3);
    }
  }
  if (0 < pSes->nSpecFunc) {
    uVar3 = 0;
    do {
      iVar16 = pSes->nGates;
      if (0 < iVar16) {
        iVar18 = 0;
        do {
          if (pSes->nSpecFunc <= (int)uVar3) {
            __assert_fail("h < pSes->nSpecFunc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                          ,0x3d2,"int Ses_ManOutputVar(Ses_Man_t *, int, int)");
          }
          uVar4 = iVar16 * uVar3 + iVar18 + pSes->nOutputOffset;
          if (((int)uVar4 < 0) || (pSes->pSat->size <= (int)uVar4)) goto LAB_002c0b05;
          if (pSes->pSat->model[uVar4] == 1) {
            *pcVar10 = (((uint)pSes->bSpecInv >> (uVar3 & 0x1f) & 1) != 0) + (char)iVar18 * '\x02';
            uVar9 = 0;
            if (pSes->nMaxDepth != -1) {
              iVar16 = pSes->nSpecVars;
              if (0 < (long)iVar16) {
                lVar12 = 0;
                uVar9 = 0;
                do {
                  if (pSes->pArrTimeProfile == (int *)0x0) {
                    uVar4 = *(uint *)((long)__ptr + lVar12 * 4 + (ulong)(uint)(iVar16 * iVar18) * 4)
                    ;
                  }
                  else {
                    uVar4 = *(int *)((long)__ptr + lVar12 * 4 + (ulong)(uint)(iVar16 * iVar18) * 4)
                            + pSes->pArrTimeProfile[lVar12];
                  }
                  if ((int)uVar9 <= (int)uVar4) {
                    uVar9 = (ulong)uVar4;
                  }
                  lVar12 = lVar12 + 1;
                } while (iVar16 != lVar12);
              }
            }
            pcVar10[1] = (char)uVar9;
            if ((pSes->pArrTimeProfile != (int *)0x0) && (pSes->fExtractVerbose != 0)) {
              printf("output %d points to gate %d and has normalized delay %d (nArrTimeDelta = %d)\n"
                     ,(ulong)uVar3,(ulong)(uint)(pSes->nSpecVars + iVar18),uVar9,
                     (ulong)(uint)pSes->nArrTimeDelta);
            }
            pcVar10 = pcVar10 + 2;
            uVar9 = (ulong)(uint)pSes->nSpecVars;
            if (0 < pSes->nSpecVars) {
              uVar15 = 0;
              do {
                if (pSes->nMaxDepth == -1) {
                  uVar4 = 0;
                }
                else {
                  uVar4 = *(uint *)((long)__ptr + (long)((int)uVar9 * iVar18 + (int)uVar15) * 4);
                }
                if ((pSes->pArrTimeProfile != (int *)0x0) && (pSes->fExtractVerbose != 0)) {
                  printf("  pin-to-pin arrival time from input %d is %d (pArrTimeProfile = %d)\n",
                         uVar15 & 0xffffffff,(ulong)uVar4,(ulong)(uint)pSes->pArrTimeProfile[uVar15]
                        );
                }
                pcVar10[uVar15] = (char)uVar4;
                uVar15 = uVar15 + 1;
                uVar9 = (ulong)pSes->nSpecVars;
              } while ((long)uVar15 < (long)uVar9);
              pcVar10 = pcVar10 + uVar15;
            }
          }
          iVar18 = iVar18 + 1;
          iVar16 = pSes->nGates;
        } while (iVar18 < iVar16);
      }
      uVar3 = uVar3 + 1;
    } while ((int)uVar3 < pSes->nSpecFunc);
  }
  if ((__ptr != (void *)0x0) && (pSes->nMaxDepth != -1)) {
    free(__ptr);
  }
  if ((long)pcVar10 - (long)pcVar5 != __nmemb) {
    __assert_fail("( p - pSol ) == nSol",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                  ,0x6d4,"char *Ses_ManExtractSolution(Ses_Man_t *)");
  }
  return pcVar5;
}

Assistant:

static char * Ses_ManExtractSolution( Ses_Man_t * pSes )
{
    int nSol, h, i, j, k, l, aj, ak, d, nOp;
    char * pSol, * p;
    int * pPerm = NULL; /* will be a 2d array [i][l] where is is gate id and l is PI id */

    /* compute length of solution, for now all gates have 2 inputs */
    nSol = 3 + pSes->nGates * 4 + pSes->nSpecFunc * ( 2 + pSes->nSpecVars );

    p = pSol = ABC_CALLOC( char, nSol );

    /* header */
    *p++ = pSes->nSpecVars;
    *p++ = pSes->nSpecFunc;
    *p++ = pSes->nGates;

    /* gates */
    for ( i = 0; i < pSes->nGates; ++i )
    {
        nOp  = sat_solver_var_value( pSes->pSat, Ses_ManGateVar( pSes, i, 0, 1 ) );
        nOp |= sat_solver_var_value( pSes->pSat, Ses_ManGateVar( pSes, i, 1, 0 ) ) << 1;
        nOp |= sat_solver_var_value( pSes->pSat, Ses_ManGateVar( pSes, i, 1, 1 ) ) << 2;

        *p++ = nOp;
        *p++ = 2;

        if ( pSes->fExtractVerbose )
            printf( "add gate %d with operation %d", pSes->nSpecVars + i, nOp );

        for ( k = 0; k < pSes->nSpecVars + i; ++k )
            for ( j = 0; j < k; ++j )
                if ( sat_solver_var_value( pSes->pSat, Ses_ManSelectVar( pSes, i, j, k ) ) )
                {
                    if ( pSes->fExtractVerbose )
                        printf( " and operands %d and %d", j, k );
                    *p++ = j;
                    *p++ = k;
                    k = pSes->nSpecVars + i;
                    break;
                }

        if ( pSes->fExtractVerbose )
        {
            if ( pSes->nMaxDepth > 0 )
            {
                printf( " and depth vector " );
                for ( j = 0; j <= pSes->nArrTimeMax + i; ++j )
                    printf( "%d", sat_solver_var_value( pSes->pSat, Ses_ManDepthVar( pSes, i, j ) ) );
            }
            printf( "\n" );
        }
    }

    /* pin-to-pin delay */
    if ( pSes->nMaxDepth != -1 )
    {
        pPerm = ABC_CALLOC( int, pSes->nGates * pSes->nSpecVars );
        for ( i = 0; i < pSes->nGates; ++i )
        {
            /* since all gates are binary for now */
            j = pSol[3 + i * 4 + 2];
            k = pSol[3 + i * 4 + 3];

            for ( l = 0; l < pSes->nSpecVars; ++l )
            {
                /* pin-to-pin delay to input l of child nodes */
                aj = j < pSes->nSpecVars ? 0 : pPerm[(j - pSes->nSpecVars) * pSes->nSpecVars + l];
                ak = k < pSes->nSpecVars ? 0 : pPerm[(k - pSes->nSpecVars) * pSes->nSpecVars + l];

                if ( aj == 0 && ak == 0 )
                    pPerm[i * pSes->nSpecVars + l] = ( l == j || l == k ) ? 1 : 0;
                else
                    pPerm[i * pSes->nSpecVars + l] = Abc_MaxInt( aj, ak ) + 1;
            }
        }
    }

    /* outputs */
    for ( h = 0; h < pSes->nSpecFunc; ++h )
        for ( i = 0; i < pSes->nGates; ++i )
            if ( sat_solver_var_value( pSes->pSat, Ses_ManOutputVar( pSes, h, i ) ) )
            {
                *p++ = Abc_Var2Lit( i, ( pSes->bSpecInv >> h ) & 1 );
                d = 0;
                if ( pSes->nMaxDepth != -1 )
                    for ( l = 0; l < pSes->nSpecVars; ++l )
                    {
                        if ( pSes->pArrTimeProfile )
                            d = Abc_MaxInt( d, pSes->pArrTimeProfile[l] + pPerm[i * pSes->nSpecVars + l] );
                        else
                            d = Abc_MaxInt( d, pPerm[i * pSes->nSpecVars + l] );
                    }
                *p++ = d;
                if ( pSes->pArrTimeProfile && pSes->fExtractVerbose )
                    printf( "output %d points to gate %d and has normalized delay %d (nArrTimeDelta = %d)\n", h, pSes->nSpecVars + i, d, pSes->nArrTimeDelta );
                for ( l = 0; l < pSes->nSpecVars; ++l )
                {
                    d = ( pSes->nMaxDepth != -1 ) ? pPerm[i * pSes->nSpecVars + l] : 0;
                    if ( pSes->pArrTimeProfile && pSes->fExtractVerbose )
                        printf( "  pin-to-pin arrival time from input %d is %d (pArrTimeProfile = %d)\n", l, d, pSes->pArrTimeProfile[l] );
                    *p++ = d;
                }
            }

    /* pin-to-pin delays */
    if ( pSes->nMaxDepth != -1 )
        ABC_FREE( pPerm );

    /* have we used all the fields? */
    assert( ( p - pSol ) == nSol );

    /* printf( "found network: " ); */
    /* Abc_TtPrintHexRev( stdout, Ses_ManDeriveTruth( pSes, pSol, 1 ), pSes->nSpecVars ); */
    /* printf( "\n" ); */

    return pSol;
}